

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O1

void VerticalFilter_C(uint8_t *data,int width,int height,int stride,uint8_t *filtered_data)

{
  long lVar1;
  uint8_t *puVar2;
  int iVar3;
  ulong uVar4;
  
  *filtered_data = *data;
  if (1 < width) {
    uVar4 = 0;
    do {
      filtered_data[uVar4 + 1] = data[uVar4 + 1] - data[uVar4];
      uVar4 = uVar4 + 1;
    } while (width - 1 != uVar4);
  }
  if (1 < height) {
    lVar1 = (long)stride;
    puVar2 = filtered_data + lVar1;
    iVar3 = 1;
    do {
      if (0 < width) {
        uVar4 = 0;
        do {
          puVar2[uVar4] = data[uVar4 + lVar1] - data[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uint)width != uVar4);
      }
      data = data + lVar1;
      iVar3 = iVar3 + 1;
      puVar2 = puVar2 + lVar1;
    } while (iVar3 != height);
  }
  return;
}

Assistant:

static WEBP_INLINE void DoVerticalFilter_C(const uint8_t* WEBP_RESTRICT in,
                                           int width, int height, int stride,
                                           uint8_t* WEBP_RESTRICT out) {
  const uint8_t* preds = in;
  int row;
  DCHECK(in, out);

  // Very first top-left pixel is copied.
  out[0] = in[0];
  // Rest of top scan-line is left-predicted.
  PredictLine_C(in + 1, preds, out + 1, width - 1);
  in += stride;
  out += stride;

  // Filter line-by-line.
  for (row = 1; row < height; ++row) {
    PredictLine_C(in, preds, out, width);
    preds += stride;
    in += stride;
    out += stride;
  }
}